

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,Function *func)

{
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars;
  double dVar1;
  pointer ppNVar2;
  long lVar3;
  ostream *poVar4;
  pointer pvVar5;
  _Base_ptr p_Var6;
  pointer pvVar7;
  pointer pmVar8;
  int c;
  char *pcVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  _Self __tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  vector<int,_std::allocator<int>_> index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::operator<<(os,"Vars: [");
  vars = &func->parents_;
  for (uVar10 = 0;
      ppNVar2 = (func->parents_).
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(func->parents_).
                             super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3);
      uVar10 = uVar10 + 1) {
    poVar4 = std::operator<<(os,(string *)&ppNVar2[uVar10]->name_);
    pcVar9 = ", ";
    if (uVar10 == ((long)(func->parents_).
                         super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(func->parents_).
                         super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
      pcVar9 = " -> ";
    }
    std::operator<<(poVar4,pcVar9);
  }
  poVar4 = std::operator<<(os,(string *)&func->child_->name_);
  poVar4 = std::operator<<(poVar4,"]");
  std::endl<char,std::char_traits<char>>(poVar4);
  pvVar7 = (func->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (func->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 == pvVar7) {
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)(func->map_).
                                super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(func->map_).
                               super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        uVar10 = uVar10 + 1) {
      Variable::ComputeIndexVec(&index,vars,(int)uVar10);
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); uVar11 = uVar11 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&str,(value_type *)
                         ((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar11] * 0x20 +
                         *(long *)&((vars->
                                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                   super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data));
      }
      poVar4 = std::operator<<(os," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_60,&str);
      poVar4 = operator<<(poVar4,&local_60);
      std::operator<<(poVar4,":");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      pmVar8 = (func->map_).
               super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var6 = *(_Base_ptr *)((long)&pmVar8[uVar10]._M_t._M_impl.super__Rb_tree_header + 0x10);
      while (p_Var6 != &pmVar8[uVar10]._M_t._M_impl.super__Rb_tree_header._M_header) {
        poVar4 = std::operator<<(os," ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        ((func->child_->super_Variable).values_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                        (int)p_Var6[1]._M_color));
        std::operator<<(poVar4,":");
        std::ostream::_M_insert<double>((double)p_Var6[1]._M_parent);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        pmVar8 = (func->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      if (((long)(func->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar8) / 0x30 - 1U != uVar10) {
        std::endl<char,std::char_traits<char>>(os);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&str);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&index.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  else {
    uVar10 = 0;
    while( true ) {
      if ((ulong)(((long)pvVar5 - (long)pvVar7) / 0x18) <= uVar10) break;
      Variable::ComputeIndexVec(&index,vars,(int)uVar10);
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2); uVar11 = uVar11 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&str,(value_type *)
                         ((long)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar11] * 0x20 +
                         *(long *)&((vars->
                                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar11]->
                                   super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data));
      }
      poVar4 = std::operator<<(os," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&str);
      poVar4 = operator<<(poVar4,&local_48);
      std::operator<<(poVar4,":");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      lVar12 = 0;
      uVar11 = 0;
      while( true ) {
        pvVar7 = (func->values_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = *(long *)&pvVar7[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar7[uVar10].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + 8) - lVar3 >> 3) <= uVar11) break;
        dVar1 = *(double *)(lVar3 + uVar11 * 8);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          poVar4 = std::operator<<(os," ");
          poVar4 = std::operator<<(poVar4,(string *)
                                          ((long)&(((func->child_->super_Variable).values_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12));
          std::operator<<(poVar4,":");
          std::ostream::_M_insert<double>
                    (*(double *)
                      (*(long *)&(func->values_).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar11 * 8));
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x20;
      }
      if (((long)(func->values_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18 - 1U != uVar10) {
        std::endl<char,std::char_traits<char>>(os);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&str);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&index.super__Vector_base<int,_std::allocator<int>_>);
      uVar10 = uVar10 + 1;
      pvVar7 = (func->values_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (func->values_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Function& func) {
	os << "Vars: [";
	for (int i = 0; i < func.parents_.size(); i++) {
		os << func.parents_[i]->name()
			<< (i == func.parents_.size() - 1 ? " -> " : ", ");
	}
	os << func.child_->name() << "]" << endl; // TODO: should print curr_name here but prev_name above for state variable

	if (func.values_.size() > 0) {
		for (int p = 0; p < func.values_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";
			for (int c = 0; c < func.values_[p].size(); c++) {
				if (func.values_[p][c] != 0)
					os << " " << func.child_->GetValue(c) << ":"
						<< func.values_[p][c];
			}
			if (p != func.values_.size() - 1)
				os << endl;
		}
	} else {
		for (int p = 0; p < func.map_.size(); p++) {
			vector<int> index = Variable::ComputeIndexVec(func.parents_, p);
			vector<string> str;
			for (int i = 0; i < index.size(); i++)
				str.push_back(func.parents_[i]->GetValue(index[i]));
			os << " " << str << ":";

			for (map<int, double>::const_iterator it = func.map_[p].begin();
				it != func.map_[p].end(); it++) {
				os << " " << func.child_->GetValue(it->first) << ":"
					<< it->second;
			}
			if (p != func.map_.size() - 1)
				os << endl;
		}
	}
	return os;
}